

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O0

void __thiscall
spdlog::details::registry::set_formatter
          (registry *this,
          unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *formatter)

{
  bool bVar1;
  pointer pfVar2;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *in_RSI;
  mutex_type *in_RDI;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *in_stack_00000008;
  logger *in_stack_00000010;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>
  *l;
  iterator __end2;
  iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>_>
  *__range2;
  lock_guard<std::mutex> lock;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>_>
  *in_stack_ffffffffffffff98;
  undefined1 local_40 [8];
  reference local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>,_true>
  local_28;
  mutex_type *local_20;
  lock_guard<std::mutex> local_18 [3];
  
  std::lock_guard<std::mutex>::lock_guard(local_18,in_RDI);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator=
            (in_RSI,(unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                    in_stack_ffffffffffffff98);
  local_20 = in_RDI + 3;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>_>
       ::begin(in_stack_ffffffffffffff98);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>_>
       ::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    local_38 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>,_false,_true>
               ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>,_false,_true>
                            *)0x2ab2fb);
    std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2ab30e);
    pfVar2 = std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator->
                       ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                        0x2ab323);
    (*pfVar2->_vptr_formatter[3])(local_40);
    logger::set_formatter(in_stack_00000010,in_stack_00000008);
    std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr(in_RSI)
    ;
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>,_false,_true>
                  *)in_RSI);
  }
  std::lock_guard<std::mutex>::~lock_guard(local_18);
  return;
}

Assistant:

SPDLOG_INLINE void registry::set_formatter(std::unique_ptr<formatter> formatter)
{
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    formatter_ = std::move(formatter);
    for (auto &l : loggers_)
    {
        l.second->set_formatter(formatter_->clone());
    }
}